

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::getResultingAccessChainType(Builder *this)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  Id typeId;
  uint uVar3;
  pointer puVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = (ulong)(this->accessChain).base;
  if (uVar5 == 0) {
    __assert_fail("accessChain.base != NoResult",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x5b8,"Id spv::Builder::getResultingAccessChainType() const");
  }
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar2 = ppIVar1[uVar5];
  if (pIVar2 == (Instruction *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = pIVar2->typeId;
  }
  if (ppIVar1[uVar3]->opCode == OpTypePointer) {
    typeId = getContainedTypeId(this,uVar3,0);
    puVar4 = (this->accessChain).indexChain.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->accessChain).indexChain.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 2)) {
      lVar6 = 0;
      do {
        ppIVar1 = (this->module).idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar3 = puVar4[lVar6];
        if (ppIVar1[typeId]->opCode == OpTypeStruct) {
          if (ppIVar1[uVar3]->opCode != OpConstant) {
            __assert_fail("isConstantScalar(accessChain.indexChain[i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                          ,0x5c0,"Id spv::Builder::getResultingAccessChainType() const");
          }
          uVar3 = getConstantScalar(this,uVar3);
        }
        typeId = getContainedTypeId(this,typeId,uVar3);
        lVar6 = lVar6 + 1;
        puVar4 = (this->accessChain).indexChain.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (lVar6 < (int)((ulong)((long)(this->accessChain).indexChain.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4
                                    ) >> 2));
    }
    return typeId;
  }
  __assert_fail("isPointerType(typeId)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x5bb,"Id spv::Builder::getResultingAccessChainType() const");
}

Assistant:

Id Builder::getResultingAccessChainType() const
{
    assert(accessChain.base != NoResult);
    Id typeId = getTypeId(accessChain.base);

    assert(isPointerType(typeId));
    typeId = getContainedTypeId(typeId);

    for (int i = 0; i < (int)accessChain.indexChain.size(); ++i) {
        if (isStructType(typeId)) {
            assert(isConstantScalar(accessChain.indexChain[i]));
            typeId = getContainedTypeId(typeId, getConstantScalar(accessChain.indexChain[i]));
        } else
            typeId = getContainedTypeId(typeId, accessChain.indexChain[i]);
    }

    return typeId;
}